

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_32x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar12;
  ushort uVar19;
  ushort uVar23;
  ushort uVar27;
  ushort uVar31;
  ushort uVar35;
  ushort uVar39;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar18 [16];
  int y_mask;
  __m128i scaled_bottom_left_hi;
  __m128i scaled_bottom_left_lo;
  __m128i inverted_weights_hi;
  __m128i inverted_weights_lo;
  __m128i weights_hi;
  __m128i weights_lo;
  __m128i weights;
  int left_offset;
  uint8_t *weights_base_ptr;
  __m128i round;
  __m128i scale;
  __m128i top4;
  __m128i top3;
  __m128i top2;
  __m128i top1;
  __m128i top_hi;
  __m128i top_lo;
  __m128i bottom_left;
  __m128i zero;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_d9c;
  int local_d5c;
  int local_ce4;
  undefined8 *local_c20;
  byte bStack_b60;
  byte bStack_b5f;
  byte bStack_b5e;
  byte bStack_b5d;
  byte bStack_b5c;
  byte bStack_b5b;
  byte bStack_b5a;
  byte bStack_b59;
  byte bStack_b40;
  byte bStack_b3f;
  byte bStack_b3e;
  byte bStack_b3d;
  byte bStack_b3c;
  byte bStack_b3b;
  byte bStack_b3a;
  byte bStack_b39;
  byte bStack_b20;
  byte bStack_b1f;
  byte bStack_b1e;
  byte bStack_b1d;
  byte bStack_b1c;
  byte bStack_b1b;
  byte bStack_b1a;
  byte bStack_b19;
  byte local_ae8;
  byte bStack_ae7;
  byte bStack_ae6;
  byte bStack_ae5;
  byte bStack_ae4;
  byte bStack_ae3;
  byte bStack_ae2;
  byte bStack_ae1;
  byte local_aa8;
  byte bStack_aa7;
  byte bStack_aa6;
  byte bStack_aa5;
  byte bStack_aa4;
  byte bStack_aa3;
  byte bStack_aa2;
  byte bStack_aa1;
  byte local_a68;
  byte bStack_a67;
  byte bStack_a66;
  byte bStack_a65;
  byte bStack_a64;
  byte bStack_a63;
  byte bStack_a62;
  byte bStack_a61;
  ushort uStack_a56;
  ushort uStack_a54;
  ushort uStack_a52;
  ushort uStack_a4e;
  ushort uStack_a4c;
  ushort uStack_a4a;
  ushort uStack_a36;
  ushort uStack_a34;
  ushort uStack_a32;
  ushort uStack_a2e;
  ushort uStack_a2c;
  ushort uStack_a2a;
  ushort uStack_a12;
  ushort uStack_a0a;
  ushort uStack_9f6;
  ushort uStack_9f4;
  ushort uStack_9f2;
  ushort uStack_9ee;
  ushort uStack_9ec;
  ushort uStack_9ea;
  ushort uStack_826;
  ushort uStack_824;
  ushort uStack_822;
  ushort uStack_81e;
  ushort uStack_81c;
  ushort uStack_81a;
  ushort uStack_806;
  ushort uStack_804;
  ushort uStack_802;
  ushort uStack_7fe;
  ushort uStack_7fc;
  ushort uStack_7fa;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  ushort uStack_666;
  ushort uStack_664;
  ushort uStack_662;
  ushort uStack_65e;
  ushort uStack_65c;
  ushort uStack_65a;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  ushort uStack_646;
  ushort uStack_644;
  ushort uStack_642;
  ushort uStack_63e;
  ushort uStack_63c;
  ushort uStack_63a;
  ushort uStack_4a6;
  ushort uStack_4a4;
  ushort uStack_4a2;
  ushort uStack_49e;
  ushort uStack_49c;
  ushort uStack_49a;
  ushort uStack_486;
  ushort uStack_484;
  ushort uStack_482;
  ushort uStack_47e;
  ushort uStack_47c;
  ushort uStack_47a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  ushort uStack_2e6;
  ushort uStack_2e4;
  ushort uStack_2e2;
  ushort uStack_2de;
  ushort uStack_2dc;
  ushort uStack_2da;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  
  bVar1 = *(byte *)(in_RCX + 0x3f);
  uVar11 = (ushort)bVar1;
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  local_a68 = (byte)uVar2;
  bStack_a67 = (byte)((ulong)uVar2 >> 8);
  bStack_a66 = (byte)((ulong)uVar2 >> 0x10);
  bStack_a65 = (byte)((ulong)uVar2 >> 0x18);
  bStack_a64 = (byte)((ulong)uVar2 >> 0x20);
  bStack_a63 = (byte)((ulong)uVar2 >> 0x28);
  bStack_a62 = (byte)((ulong)uVar2 >> 0x30);
  bStack_a61 = (byte)((ulong)uVar2 >> 0x38);
  bStack_b20 = (byte)uVar3;
  bStack_b1f = (byte)((ulong)uVar3 >> 8);
  bStack_b1e = (byte)((ulong)uVar3 >> 0x10);
  bStack_b1d = (byte)((ulong)uVar3 >> 0x18);
  bStack_b1c = (byte)((ulong)uVar3 >> 0x20);
  bStack_b1b = (byte)((ulong)uVar3 >> 0x28);
  bStack_b1a = (byte)((ulong)uVar3 >> 0x30);
  bStack_b19 = (byte)((ulong)uVar3 >> 0x38);
  local_aa8 = (byte)uVar4;
  bStack_aa7 = (byte)((ulong)uVar4 >> 8);
  bStack_aa6 = (byte)((ulong)uVar4 >> 0x10);
  bStack_aa5 = (byte)((ulong)uVar4 >> 0x18);
  bStack_aa4 = (byte)((ulong)uVar4 >> 0x20);
  bStack_aa3 = (byte)((ulong)uVar4 >> 0x28);
  bStack_aa2 = (byte)((ulong)uVar4 >> 0x30);
  bStack_aa1 = (byte)((ulong)uVar4 >> 0x38);
  bStack_b40 = (byte)uVar5;
  bStack_b3f = (byte)((ulong)uVar5 >> 8);
  bStack_b3e = (byte)((ulong)uVar5 >> 0x10);
  bStack_b3d = (byte)((ulong)uVar5 >> 0x18);
  bStack_b3c = (byte)((ulong)uVar5 >> 0x20);
  bStack_b3b = (byte)((ulong)uVar5 >> 0x28);
  bStack_b3a = (byte)((ulong)uVar5 >> 0x30);
  bStack_b39 = (byte)((ulong)uVar5 >> 0x38);
  local_c20 = in_RDI;
  for (local_ce4 = 0; local_ce4 < 0x40; local_ce4 = local_ce4 + 0x10) {
    uVar2 = *(undefined8 *)(smooth_weights + (long)local_ce4 + 0x3c);
    uVar3 = *(undefined8 *)(smooth_weights + (long)local_ce4 + 0x44);
    local_ae8 = (byte)uVar2;
    bStack_ae7 = (byte)((ulong)uVar2 >> 8);
    bStack_ae6 = (byte)((ulong)uVar2 >> 0x10);
    bStack_ae5 = (byte)((ulong)uVar2 >> 0x18);
    bStack_ae4 = (byte)((ulong)uVar2 >> 0x20);
    bStack_ae3 = (byte)((ulong)uVar2 >> 0x28);
    bStack_ae2 = (byte)((ulong)uVar2 >> 0x30);
    bStack_ae1 = (byte)((ulong)uVar2 >> 0x38);
    bStack_b60 = (byte)uVar3;
    bStack_b5f = (byte)((ulong)uVar3 >> 8);
    bStack_b5e = (byte)((ulong)uVar3 >> 0x10);
    bStack_b5d = (byte)((ulong)uVar3 >> 0x18);
    bStack_b5c = (byte)((ulong)uVar3 >> 0x20);
    bStack_b5b = (byte)((ulong)uVar3 >> 0x28);
    bStack_b5a = (byte)((ulong)uVar3 >> 0x30);
    bStack_b59 = (byte)((ulong)uVar3 >> 0x38);
    uStack_a36 = (ushort)bStack_ae7;
    uStack_a34 = (ushort)bStack_ae6;
    uStack_a32 = (ushort)bStack_ae5;
    uStack_a2e = (ushort)bStack_ae3;
    uStack_a2c = (ushort)bStack_ae2;
    uStack_a2a = (ushort)bStack_ae1;
    uStack_a56 = (ushort)bStack_b5f;
    uStack_a54 = (ushort)bStack_b5e;
    uStack_a52 = (ushort)bStack_b5d;
    uStack_a4e = (ushort)bStack_b5b;
    uStack_a4c = (ushort)bStack_b5a;
    uStack_a4a = (ushort)bStack_b59;
    uStack_9f6 = (ushort)bVar1;
    uStack_9f4 = (ushort)bVar1;
    uStack_9f2 = (ushort)bVar1;
    uStack_9ee = (ushort)bVar1;
    uStack_9ec = (ushort)bVar1;
    uStack_9ea = (ushort)bVar1;
    uStack_a12 = (ushort)bVar1;
    uStack_a0a = (ushort)bVar1;
    for (local_d5c = 0x1000100; local_d5c < 0xf0e0f0f; local_d5c = local_d5c + 0x2020202) {
      auVar10[1] = 0;
      auVar10[0] = local_ae8;
      auVar10[2] = bStack_ae7;
      auVar10[3] = 0;
      auVar10[4] = bStack_ae6;
      auVar10[5] = 0;
      auVar10[6] = bStack_ae5;
      auVar10[7] = 0;
      auVar10[9] = 0;
      auVar10[8] = bStack_ae4;
      auVar10[10] = bStack_ae3;
      auVar10[0xb] = 0;
      auVar10[0xc] = bStack_ae2;
      auVar10[0xd] = 0;
      auVar10[0xe] = bStack_ae1;
      auVar10[0xf] = 0;
      auVar9._8_8_ = CONCAT44(local_d5c,local_d5c);
      auVar9._0_8_ = CONCAT44(local_d5c,local_d5c);
      auVar16 = pshufb(auVar10,auVar9);
      auVar8._2_2_ = (0x100 - uStack_a36) * uStack_9f6;
      auVar8._0_2_ = (0x100 - (ushort)local_ae8) * uVar11;
      auVar8._4_2_ = (0x100 - uStack_a34) * uStack_9f4;
      auVar8._6_2_ = (0x100 - uStack_a32) * uStack_9f2;
      auVar8._10_2_ = (0x100 - uStack_a2e) * uStack_9ee;
      auVar8._8_2_ = (0x100 - (ushort)bStack_ae4) * uVar11;
      auVar8._12_2_ = (0x100 - uStack_a2c) * uStack_9ec;
      auVar8._14_2_ = (0x100 - uStack_a2a) * uStack_9ea;
      auVar7._8_8_ = CONCAT44(local_d5c,local_d5c);
      auVar7._0_8_ = CONCAT44(local_d5c,local_d5c);
      auVar17 = pshufb(auVar8,auVar7);
      uStack_2c6 = (ushort)bStack_a67;
      uStack_2c4 = (ushort)bStack_a66;
      uStack_2c2 = (ushort)bStack_a65;
      uStack_2be = (ushort)bStack_a63;
      uStack_2bc = (ushort)bStack_a62;
      uStack_2ba = (ushort)bStack_a61;
      local_2d8 = auVar16._0_2_;
      sStack_2d6 = auVar16._2_2_;
      sStack_2d4 = auVar16._4_2_;
      sStack_2d2 = auVar16._6_2_;
      sStack_2d0 = auVar16._8_2_;
      sStack_2ce = auVar16._10_2_;
      sStack_2cc = auVar16._12_2_;
      sStack_2ca = auVar16._14_2_;
      uStack_2e6 = (ushort)bStack_b1f;
      uStack_2e4 = (ushort)bStack_b1e;
      uStack_2e2 = (ushort)bStack_b1d;
      uStack_2de = (ushort)bStack_b1b;
      uStack_2dc = (ushort)bStack_b1a;
      uStack_2da = (ushort)bStack_b19;
      local_308 = auVar17._0_2_;
      sStack_306 = auVar17._2_2_;
      sStack_304 = auVar17._4_2_;
      sStack_302 = auVar17._6_2_;
      sStack_300 = auVar17._8_2_;
      sStack_2fe = auVar17._10_2_;
      sStack_2fc = auVar17._12_2_;
      sStack_2fa = auVar17._14_2_;
      uVar12 = local_308 + (ushort)local_a68 * local_2d8 + 0x80;
      uVar19 = sStack_306 + uStack_2c6 * sStack_2d6 + 0x80;
      uVar23 = sStack_304 + uStack_2c4 * sStack_2d4 + 0x80;
      uVar27 = sStack_302 + uStack_2c2 * sStack_2d2 + 0x80;
      uVar31 = sStack_300 + (ushort)bStack_a64 * sStack_2d0 + 0x80;
      uVar35 = sStack_2fe + uStack_2be * sStack_2ce + 0x80;
      uVar39 = sStack_2fc + uStack_2bc * sStack_2cc + 0x80;
      uVar43 = sStack_2fa + uStack_2ba * sStack_2ca + 0x80;
      uVar13 = uVar12 >> 8;
      uVar20 = uVar19 >> 8;
      uVar24 = uVar23 >> 8;
      uVar28 = uVar27 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar40 = uVar39 >> 8;
      uVar44 = uVar43 >> 8;
      uVar14 = local_308 + (ushort)bStack_b20 * local_2d8 + 0x80;
      uVar21 = sStack_306 + uStack_2e6 * sStack_2d6 + 0x80;
      uVar25 = sStack_304 + uStack_2e4 * sStack_2d4 + 0x80;
      uVar29 = sStack_302 + uStack_2e2 * sStack_2d2 + 0x80;
      uVar33 = sStack_300 + (ushort)bStack_b1c * sStack_2d0 + 0x80;
      uVar37 = sStack_2fe + uStack_2de * sStack_2ce + 0x80;
      uVar41 = sStack_2fc + uStack_2dc * sStack_2cc + 0x80;
      uVar45 = sStack_2fa + uStack_2da * sStack_2ca + 0x80;
      uVar15 = uVar14 >> 8;
      uVar22 = uVar21 >> 8;
      uVar26 = uVar25 >> 8;
      uVar30 = uVar29 >> 8;
      uVar34 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar42 = uVar41 >> 8;
      uVar46 = uVar45 >> 8;
      *local_c20 = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44)
                            ,CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                      (0xff < uVar40),
                                      CONCAT15((uVar36 != 0) * (uVar36 < 0x100) *
                                               (char)(uVar35 >> 8) - (0xff < uVar36),
                                               CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                        (char)(uVar31 >> 8) - (0xff < uVar32),
                                                        CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                                 (char)(uVar27 >> 8) -
                                                                 (0xff < uVar28),
                                                                 CONCAT12((uVar24 != 0) *
                                                                          (uVar24 < 0x100) *
                                                                          (char)(uVar23 >> 8) -
                                                                          (0xff < uVar24),
                                                                          CONCAT11((uVar20 != 0) *
                                                                                   (uVar20 < 0x100)
                                                                                   * (char)(uVar19 
                                                  >> 8) - (0xff < uVar20),
                                                  (uVar13 != 0) * (uVar13 < 0x100) *
                                                  (char)(uVar12 >> 8) - (0xff < uVar13))))))));
      local_c20[1] = CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                              (0xff < uVar46),
                              CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                       (0xff < uVar42),
                                       CONCAT15((uVar38 != 0) * (uVar38 < 0x100) *
                                                (char)(uVar37 >> 8) - (0xff < uVar38),
                                                CONCAT14((uVar34 != 0) * (uVar34 < 0x100) *
                                                         (char)(uVar33 >> 8) - (0xff < uVar34),
                                                         CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                                  (char)(uVar29 >> 8) -
                                                                  (0xff < uVar30),
                                                                  CONCAT12((uVar26 != 0) *
                                                                           (uVar26 < 0x100) *
                                                                           (char)(uVar25 >> 8) -
                                                                           (0xff < uVar26),
                                                                           CONCAT11((uVar22 != 0) *
                                                                                    (uVar22 < 0x100)
                                                                                    * (char)(uVar21 
                                                  >> 8) - (0xff < uVar22),
                                                  (uVar15 != 0) * (uVar15 < 0x100) *
                                                  (char)(uVar14 >> 8) - (0xff < uVar15))))))));
      uStack_486 = (ushort)bStack_aa7;
      uStack_484 = (ushort)bStack_aa6;
      uStack_482 = (ushort)bStack_aa5;
      uStack_47e = (ushort)bStack_aa3;
      uStack_47c = (ushort)bStack_aa2;
      uStack_47a = (ushort)bStack_aa1;
      uStack_4a6 = (ushort)bStack_b3f;
      uStack_4a4 = (ushort)bStack_b3e;
      uStack_4a2 = (ushort)bStack_b3d;
      uStack_49e = (ushort)bStack_b3b;
      uStack_49c = (ushort)bStack_b3a;
      uStack_49a = (ushort)bStack_b39;
      uVar12 = local_308 + (ushort)local_aa8 * local_2d8 + 0x80;
      uVar19 = sStack_306 + uStack_486 * sStack_2d6 + 0x80;
      uVar23 = sStack_304 + uStack_484 * sStack_2d4 + 0x80;
      uVar27 = sStack_302 + uStack_482 * sStack_2d2 + 0x80;
      uVar31 = sStack_300 + (ushort)bStack_aa4 * sStack_2d0 + 0x80;
      uVar35 = sStack_2fe + uStack_47e * sStack_2ce + 0x80;
      uVar39 = sStack_2fc + uStack_47c * sStack_2cc + 0x80;
      uVar43 = sStack_2fa + uStack_47a * sStack_2ca + 0x80;
      uVar13 = uVar12 >> 8;
      uVar20 = uVar19 >> 8;
      uVar24 = uVar23 >> 8;
      uVar28 = uVar27 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar40 = uVar39 >> 8;
      uVar44 = uVar43 >> 8;
      uVar14 = local_308 + (ushort)bStack_b40 * local_2d8 + 0x80;
      uVar21 = sStack_306 + uStack_4a6 * sStack_2d6 + 0x80;
      uVar25 = sStack_304 + uStack_4a4 * sStack_2d4 + 0x80;
      uVar29 = sStack_302 + uStack_4a2 * sStack_2d2 + 0x80;
      uVar33 = sStack_300 + (ushort)bStack_b3c * sStack_2d0 + 0x80;
      uVar37 = sStack_2fe + uStack_49e * sStack_2ce + 0x80;
      uVar41 = sStack_2fc + uStack_49c * sStack_2cc + 0x80;
      uVar45 = sStack_2fa + uStack_49a * sStack_2ca + 0x80;
      uVar15 = uVar14 >> 8;
      uVar22 = uVar21 >> 8;
      uVar26 = uVar25 >> 8;
      uVar30 = uVar29 >> 8;
      uVar34 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar42 = uVar41 >> 8;
      uVar46 = uVar45 >> 8;
      local_c20[2] = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                              (0xff < uVar44),
                              CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                       (0xff < uVar40),
                                       CONCAT15((uVar36 != 0) * (uVar36 < 0x100) *
                                                (char)(uVar35 >> 8) - (0xff < uVar36),
                                                CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                         (char)(uVar31 >> 8) - (0xff < uVar32),
                                                         CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                                  (char)(uVar27 >> 8) -
                                                                  (0xff < uVar28),
                                                                  CONCAT12((uVar24 != 0) *
                                                                           (uVar24 < 0x100) *
                                                                           (char)(uVar23 >> 8) -
                                                                           (0xff < uVar24),
                                                                           CONCAT11((uVar20 != 0) *
                                                                                    (uVar20 < 0x100)
                                                                                    * (char)(uVar19 
                                                  >> 8) - (0xff < uVar20),
                                                  (uVar13 != 0) * (uVar13 < 0x100) *
                                                  (char)(uVar12 >> 8) - (0xff < uVar13))))))));
      local_c20[3] = CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                              (0xff < uVar46),
                              CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                       (0xff < uVar42),
                                       CONCAT15((uVar38 != 0) * (uVar38 < 0x100) *
                                                (char)(uVar37 >> 8) - (0xff < uVar38),
                                                CONCAT14((uVar34 != 0) * (uVar34 < 0x100) *
                                                         (char)(uVar33 >> 8) - (0xff < uVar34),
                                                         CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                                  (char)(uVar29 >> 8) -
                                                                  (0xff < uVar30),
                                                                  CONCAT12((uVar26 != 0) *
                                                                           (uVar26 < 0x100) *
                                                                           (char)(uVar25 >> 8) -
                                                                           (0xff < uVar26),
                                                                           CONCAT11((uVar22 != 0) *
                                                                                    (uVar22 < 0x100)
                                                                                    * (char)(uVar21 
                                                  >> 8) - (0xff < uVar22),
                                                  (uVar15 != 0) * (uVar15 < 0x100) *
                                                  (char)(uVar14 >> 8) - (0xff < uVar15))))))));
      local_c20 = (undefined8 *)(in_RSI + (long)local_c20);
    }
    for (local_d9c = 0x1000100; local_d9c < 0xf0e0f0f; local_d9c = local_d9c + 0x2020202) {
      auVar6[1] = 0;
      auVar6[0] = bStack_b60;
      auVar6[2] = bStack_b5f;
      auVar6[3] = 0;
      auVar6[4] = bStack_b5e;
      auVar6[5] = 0;
      auVar6[6] = bStack_b5d;
      auVar6[7] = 0;
      auVar6[9] = 0;
      auVar6[8] = bStack_b5c;
      auVar6[10] = bStack_b5b;
      auVar6[0xb] = 0;
      auVar6[0xc] = bStack_b5a;
      auVar6[0xd] = 0;
      auVar6[0xe] = bStack_b59;
      auVar6[0xf] = 0;
      auVar18._8_8_ = CONCAT44(local_d9c,local_d9c);
      auVar18._0_8_ = CONCAT44(local_d9c,local_d9c);
      auVar18 = pshufb(auVar6,auVar18);
      auVar17._2_2_ = (0x100 - uStack_a56) * uStack_9f6;
      auVar17._0_2_ = (0x100 - (ushort)bStack_b60) * uVar11;
      auVar17._4_2_ = (0x100 - uStack_a54) * uStack_9f4;
      auVar17._6_2_ = (0x100 - uStack_a52) * uStack_a12;
      auVar17._10_2_ = (0x100 - uStack_a4e) * uStack_9ee;
      auVar17._8_2_ = (0x100 - (ushort)bStack_b5c) * uVar11;
      auVar17._12_2_ = (0x100 - uStack_a4c) * uStack_9ec;
      auVar17._14_2_ = (0x100 - uStack_a4a) * uStack_a0a;
      auVar16._8_8_ = CONCAT44(local_d9c,local_d9c);
      auVar16._0_8_ = CONCAT44(local_d9c,local_d9c);
      auVar16 = pshufb(auVar17,auVar16);
      uStack_646 = (ushort)bStack_a67;
      uStack_644 = (ushort)bStack_a66;
      uStack_642 = (ushort)bStack_a65;
      uStack_63e = (ushort)bStack_a63;
      uStack_63c = (ushort)bStack_a62;
      uStack_63a = (ushort)bStack_a61;
      local_658 = auVar18._0_2_;
      sStack_656 = auVar18._2_2_;
      sStack_654 = auVar18._4_2_;
      sStack_652 = auVar18._6_2_;
      sStack_650 = auVar18._8_2_;
      sStack_64e = auVar18._10_2_;
      sStack_64c = auVar18._12_2_;
      sStack_64a = auVar18._14_2_;
      uStack_666 = (ushort)bStack_b1f;
      uStack_664 = (ushort)bStack_b1e;
      uStack_662 = (ushort)bStack_b1d;
      uStack_65e = (ushort)bStack_b1b;
      uStack_65c = (ushort)bStack_b1a;
      uStack_65a = (ushort)bStack_b19;
      local_688 = auVar16._0_2_;
      sStack_686 = auVar16._2_2_;
      sStack_684 = auVar16._4_2_;
      sStack_682 = auVar16._6_2_;
      sStack_680 = auVar16._8_2_;
      sStack_67e = auVar16._10_2_;
      sStack_67c = auVar16._12_2_;
      sStack_67a = auVar16._14_2_;
      uVar12 = local_688 + (ushort)local_a68 * local_658 + 0x80;
      uVar19 = sStack_686 + uStack_646 * sStack_656 + 0x80;
      uVar23 = sStack_684 + uStack_644 * sStack_654 + 0x80;
      uVar27 = sStack_682 + uStack_642 * sStack_652 + 0x80;
      uVar31 = sStack_680 + (ushort)bStack_a64 * sStack_650 + 0x80;
      uVar35 = sStack_67e + uStack_63e * sStack_64e + 0x80;
      uVar39 = sStack_67c + uStack_63c * sStack_64c + 0x80;
      uVar43 = sStack_67a + uStack_63a * sStack_64a + 0x80;
      uVar13 = uVar12 >> 8;
      uVar20 = uVar19 >> 8;
      uVar24 = uVar23 >> 8;
      uVar28 = uVar27 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar40 = uVar39 >> 8;
      uVar44 = uVar43 >> 8;
      uVar14 = local_688 + (ushort)bStack_b20 * local_658 + 0x80;
      uVar21 = sStack_686 + uStack_666 * sStack_656 + 0x80;
      uVar25 = sStack_684 + uStack_664 * sStack_654 + 0x80;
      uVar29 = sStack_682 + uStack_662 * sStack_652 + 0x80;
      uVar33 = sStack_680 + (ushort)bStack_b1c * sStack_650 + 0x80;
      uVar37 = sStack_67e + uStack_65e * sStack_64e + 0x80;
      uVar41 = sStack_67c + uStack_65c * sStack_64c + 0x80;
      uVar45 = sStack_67a + uStack_65a * sStack_64a + 0x80;
      uVar15 = uVar14 >> 8;
      uVar22 = uVar21 >> 8;
      uVar26 = uVar25 >> 8;
      uVar30 = uVar29 >> 8;
      uVar34 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar42 = uVar41 >> 8;
      uVar46 = uVar45 >> 8;
      *local_c20 = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44)
                            ,CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                      (0xff < uVar40),
                                      CONCAT15((uVar36 != 0) * (uVar36 < 0x100) *
                                               (char)(uVar35 >> 8) - (0xff < uVar36),
                                               CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                        (char)(uVar31 >> 8) - (0xff < uVar32),
                                                        CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                                 (char)(uVar27 >> 8) -
                                                                 (0xff < uVar28),
                                                                 CONCAT12((uVar24 != 0) *
                                                                          (uVar24 < 0x100) *
                                                                          (char)(uVar23 >> 8) -
                                                                          (0xff < uVar24),
                                                                          CONCAT11((uVar20 != 0) *
                                                                                   (uVar20 < 0x100)
                                                                                   * (char)(uVar19 
                                                  >> 8) - (0xff < uVar20),
                                                  (uVar13 != 0) * (uVar13 < 0x100) *
                                                  (char)(uVar12 >> 8) - (0xff < uVar13))))))));
      local_c20[1] = CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                              (0xff < uVar46),
                              CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                       (0xff < uVar42),
                                       CONCAT15((uVar38 != 0) * (uVar38 < 0x100) *
                                                (char)(uVar37 >> 8) - (0xff < uVar38),
                                                CONCAT14((uVar34 != 0) * (uVar34 < 0x100) *
                                                         (char)(uVar33 >> 8) - (0xff < uVar34),
                                                         CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                                  (char)(uVar29 >> 8) -
                                                                  (0xff < uVar30),
                                                                  CONCAT12((uVar26 != 0) *
                                                                           (uVar26 < 0x100) *
                                                                           (char)(uVar25 >> 8) -
                                                                           (0xff < uVar26),
                                                                           CONCAT11((uVar22 != 0) *
                                                                                    (uVar22 < 0x100)
                                                                                    * (char)(uVar21 
                                                  >> 8) - (0xff < uVar22),
                                                  (uVar15 != 0) * (uVar15 < 0x100) *
                                                  (char)(uVar14 >> 8) - (0xff < uVar15))))))));
      uStack_806 = (ushort)bStack_aa7;
      uStack_804 = (ushort)bStack_aa6;
      uStack_802 = (ushort)bStack_aa5;
      uStack_7fe = (ushort)bStack_aa3;
      uStack_7fc = (ushort)bStack_aa2;
      uStack_7fa = (ushort)bStack_aa1;
      uStack_826 = (ushort)bStack_b3f;
      uStack_824 = (ushort)bStack_b3e;
      uStack_822 = (ushort)bStack_b3d;
      uStack_81e = (ushort)bStack_b3b;
      uStack_81c = (ushort)bStack_b3a;
      uStack_81a = (ushort)bStack_b39;
      uVar12 = local_688 + (ushort)local_aa8 * local_658 + 0x80;
      uVar19 = sStack_686 + uStack_806 * sStack_656 + 0x80;
      uVar23 = sStack_684 + uStack_804 * sStack_654 + 0x80;
      uVar27 = sStack_682 + uStack_802 * sStack_652 + 0x80;
      uVar31 = sStack_680 + (ushort)bStack_aa4 * sStack_650 + 0x80;
      uVar35 = sStack_67e + uStack_7fe * sStack_64e + 0x80;
      uVar39 = sStack_67c + uStack_7fc * sStack_64c + 0x80;
      uVar43 = sStack_67a + uStack_7fa * sStack_64a + 0x80;
      uVar13 = uVar12 >> 8;
      uVar20 = uVar19 >> 8;
      uVar24 = uVar23 >> 8;
      uVar28 = uVar27 >> 8;
      uVar32 = uVar31 >> 8;
      uVar36 = uVar35 >> 8;
      uVar40 = uVar39 >> 8;
      uVar44 = uVar43 >> 8;
      uVar14 = local_688 + (ushort)bStack_b40 * local_658 + 0x80;
      uVar21 = sStack_686 + uStack_826 * sStack_656 + 0x80;
      uVar25 = sStack_684 + uStack_824 * sStack_654 + 0x80;
      uVar29 = sStack_682 + uStack_822 * sStack_652 + 0x80;
      uVar33 = sStack_680 + (ushort)bStack_b3c * sStack_650 + 0x80;
      uVar37 = sStack_67e + uStack_81e * sStack_64e + 0x80;
      uVar41 = sStack_67c + uStack_81c * sStack_64c + 0x80;
      uVar45 = sStack_67a + uStack_81a * sStack_64a + 0x80;
      uVar15 = uVar14 >> 8;
      uVar22 = uVar21 >> 8;
      uVar26 = uVar25 >> 8;
      uVar30 = uVar29 >> 8;
      uVar34 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar42 = uVar41 >> 8;
      uVar46 = uVar45 >> 8;
      local_c20[2] = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) -
                              (0xff < uVar44),
                              CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                       (0xff < uVar40),
                                       CONCAT15((uVar36 != 0) * (uVar36 < 0x100) *
                                                (char)(uVar35 >> 8) - (0xff < uVar36),
                                                CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                         (char)(uVar31 >> 8) - (0xff < uVar32),
                                                         CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                                  (char)(uVar27 >> 8) -
                                                                  (0xff < uVar28),
                                                                  CONCAT12((uVar24 != 0) *
                                                                           (uVar24 < 0x100) *
                                                                           (char)(uVar23 >> 8) -
                                                                           (0xff < uVar24),
                                                                           CONCAT11((uVar20 != 0) *
                                                                                    (uVar20 < 0x100)
                                                                                    * (char)(uVar19 
                                                  >> 8) - (0xff < uVar20),
                                                  (uVar13 != 0) * (uVar13 < 0x100) *
                                                  (char)(uVar12 >> 8) - (0xff < uVar13))))))));
      local_c20[3] = CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) -
                              (0xff < uVar46),
                              CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) -
                                       (0xff < uVar42),
                                       CONCAT15((uVar38 != 0) * (uVar38 < 0x100) *
                                                (char)(uVar37 >> 8) - (0xff < uVar38),
                                                CONCAT14((uVar34 != 0) * (uVar34 < 0x100) *
                                                         (char)(uVar33 >> 8) - (0xff < uVar34),
                                                         CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                                  (char)(uVar29 >> 8) -
                                                                  (0xff < uVar30),
                                                                  CONCAT12((uVar26 != 0) *
                                                                           (uVar26 < 0x100) *
                                                                           (char)(uVar25 >> 8) -
                                                                           (0xff < uVar26),
                                                                           CONCAT11((uVar22 != 0) *
                                                                                    (uVar22 < 0x100)
                                                                                    * (char)(uVar21 
                                                  >> 8) - (0xff < uVar22),
                                                  (uVar15 != 0) * (uVar15 < 0x100) *
                                                  (char)(uVar14 >> 8) - (0xff < uVar15))))))));
      local_c20 = (undefined8 *)(in_RSI + (long)local_c20);
    }
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);

    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}